

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::Jacobi
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_88;
  double local_80;
  double local_78;
  REAL local_70;
  ulong local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  if (0 < num) {
    local_78 = JacobiA;
    local_80 = JacobiB;
    local_88 = 1.0;
    local_70 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_88);
    local_88 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_88);
    if (num != 1) {
      local_88 = ((local_78 + 2.0 + local_80) * local_70 + (local_78 - local_80)) * 0.5;
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0);
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)(ulong)(num - 1)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_88 = ((double)num + local_78 + local_80 + 1.0) * 0.5 * phi->fElem[num - 1];
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      if (2 < num) {
        local_48._8_4_ = DAT_014f8310._8_4_;
        local_48._0_8_ = (ulong)(local_80 * local_80 - local_78 * local_78) ^ (ulong)DAT_014f8310;
        local_48._12_4_ = DAT_014f8310._12_4_;
        local_68 = (ulong)(uint)num;
        lVar3 = 0;
        uVar2 = 2;
        do {
          local_50 = (double)(int)uVar2;
          local_60 = local_50 + local_50 + local_78 + local_80;
          local_58 = local_60 + 2.0;
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar2) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)(uVar2 - 2)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          uVar1 = uVar2 + 1;
          dVar5 = local_80 + local_78 + local_50 + 1.0;
          dVar4 = (double)((int)lVar3 + 6) * dVar5;
          local_88 = ((((local_60 + 1.0) * local_58) / dVar4) * local_70 +
                     ((local_60 + 1.0) * (double)local_48._0_8_) / (dVar4 * local_60)) *
                     *(double *)((long)phi->fElem + lVar3 * 4 + 8) -
                     (((local_50 + local_80) * (local_78 + local_50) * local_58) /
                     ((double)(int)uVar1 * dVar5 * local_60)) *
                     *(double *)((long)phi->fElem + lVar3 * 4);
          (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(phi,uVar2,0,&local_88);
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar2) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_88 = dVar5 * 0.5 * *(double *)((long)phi->fElem + lVar3 * 4 + 8);
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,0,uVar2,&local_88);
          lVar3 = lVar3 + 2;
          uVar2 = uVar1;
        } while (uVar1 != local_68);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Jacobi(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		// Quadratic or higher shape functions
        REAL a = JacobiA, b = JacobiB;
		if(num <= 0) return;
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, 0.5 * (a - b + (2.0 + a + b) * x));
		dphi.Put(0,1, 0.5*(num + a + b + 1)*phi(num-1,0) );
        // Following http://mathworld.wolfram.com/JacobiPolynomial.html
        REAL A_ab=0.0, B_ab=0.0, C_ab=0.0;
		for(int ord = 2;ord<num;ord++) {
            //Computing Coefficients for three terms recursion relation
            A_ab = ((2.0*ord+a+b+1)*(2.0*ord+a+b+2))/(2.0*(ord+1)*(ord+a+b+1));
            B_ab = ((b*b-a*a)*(2.0*ord+a+b+1))/(2.0*(ord+1)*(ord+a+b+1)*(2.0*ord+a+b));
            C_ab = ((ord+a)*(ord+b)*(2.0*ord+a+b+2))/((ord+1)*(ord+a+b+1)*(2.0*ord+a+b));
			phi.Put(ord,0, (A_ab*x - B_ab)*phi(ord-1,0) - C_ab*phi(ord-2,0));
			dphi.Put(0,ord, 0.5*(ord + a + b + 1)*phi(ord-1,0));
		}
	}